

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoInline.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::NoInline::run(NoInline *this,Module *module)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer puVar3;
  Function *pFVar4;
  char *pcVar5;
  bool bVar6;
  long *plVar7;
  size_type *psVar8;
  pointer puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string pattern;
  string local_50;
  
  __rhs = &(this->super_Pass).name;
  pattern.field_2._8_8_ = this;
  std::operator+(&local_98,"Usage usage:  wasm-opt --",__rhs);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar1 = &local_50.field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar7[3];
    local_50._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_50._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Pass::getArgument((string *)local_78,(Pass *)pattern.field_2._8_8_,__rhs,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  puVar9 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar3) {
    do {
      pFVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar5 = *(char **)((long)&(pFVar4->super_Importable).super_Named + 8);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar5,
                 pcVar5 + *(long *)&(pFVar4->super_Importable).super_Named);
      bVar6 = String::wildcardMatch((string *)local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        uVar2 = *(uint *)(pattern.field_2._8_8_ + 0x58);
        if ((uVar2 & 0xfffffffd) == 0) {
          ((puVar9->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->noFullInline = true;
        }
        if (uVar2 - 1 < 2) {
          ((puVar9->_M_t).
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->noPartialInline = true;
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar3);
  }
  if (local_78 != (undefined1  [8])&pattern._M_string_length) {
    operator_delete((void *)local_78,pattern._M_string_length + 1);
  }
  return;
}

Assistant:

void run(Module* module) override {
    std::string pattern =
      getArgument(name, "Usage usage:  wasm-opt --" + name + "=WILDCARD");

    for (auto& func : module->functions) {
      if (!String::wildcardMatch(pattern, func->name.toString())) {
        continue;
      }

      if (mode == Full || mode == Both) {
        func->noFullInline = true;
      }
      if (mode == Partial || mode == Both) {
        func->noPartialInline = true;
      }
    }
  }